

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SCAEngine.h
# Opt level: O0

void __thiscall
Js::SCAEngine<unsigned_int,_void_*,_Js::DeserializationCloner<Js::StreamReader>_>::SCAEngine
          (SCAEngine<unsigned_int,_void_*,_Js::DeserializationCloner<Js::StreamReader>_> *this,
          DeserializationCloner<Js::StreamReader> *cloner,Var *m_transferableVars,
          size_t cTransferableVars)

{
  ScriptContext *this_00;
  Recycler *pRVar1;
  BaseDictionary<unsigned_int,_void_*,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *this_01;
  TrackAllocData local_58;
  Recycler *local_30;
  Recycler *recycler;
  size_t cTransferableVars_local;
  Var *m_transferableVars_local;
  DeserializationCloner<Js::StreamReader> *cloner_local;
  SCAEngine<unsigned_int,_void_*,_Js::DeserializationCloner<Js::StreamReader>_> *this_local;
  
  this->m_cloner = cloner;
  this->m_transferableVars = m_transferableVars;
  this->m_cTransferableVars = cTransferableVars;
  recycler = (Recycler *)cTransferableVars;
  cTransferableVars_local = (size_t)m_transferableVars;
  m_transferableVars_local = (Var *)cloner;
  cloner_local = (DeserializationCloner<Js::StreamReader> *)this;
  this_00 = ScriptContextHolder::GetScriptContext((ScriptContextHolder *)cloner);
  pRVar1 = ScriptContext::GetRecycler(this_00);
  local_30 = pRVar1;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_58,
             (type_info *)
             &JsUtil::
              BaseDictionary<unsigned_int,void*,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
              ::typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/SCACore/SCAEngine.h"
             ,0x2a);
  pRVar1 = Memory::Recycler::TrackAllocInfo(pRVar1,&local_58);
  this_01 = (BaseDictionary<unsigned_int,_void_*,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
             *)new<Memory::Recycler>(0x38,pRVar1,0x43c4b0);
  JsUtil::
  BaseDictionary<unsigned_int,_void_*,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::BaseDictionary(this_01,local_30,0);
  this->m_clonedObjects = this_01;
  ClonerBase<unsigned_int,_void_*,_SCATypeId,_Js::DeserializationCloner<Js::StreamReader>_>::
  SetEngine(&this->m_cloner->
             super_ClonerBase<unsigned_int,_void_*,_SCATypeId,_Js::DeserializationCloner<Js::StreamReader>_>
            ,this);
  return;
}

Assistant:

SCAEngine(Cloner* cloner, Var* m_transferableVars, size_t cTransferableVars)
            : m_cloner(cloner),
            m_transferableVars(m_transferableVars),
            m_cTransferableVars(cTransferableVars)
        {
            Recycler* recycler = cloner->GetScriptContext()->GetRecycler();
            m_clonedObjects = RecyclerNew(recycler, ClonedObjectDictionary, recycler);
            m_cloner->SetEngine(this);
        }